

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

bool __thiscall
cfd::core::ScriptElement::ConvertBinaryToNumber(ScriptElement *this,int64_t *int64_value)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  size_t i;
  ulong uVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
                     &this->binary_data_);
  if (this->type_ - kElementBinary < 2) {
    uVar1 = (long)local_30._M_impl.super__Vector_impl_data._M_finish -
            (long)local_30._M_impl.super__Vector_impl_data._M_start;
    if ((uVar1 < 6) && ((local_30._M_impl.super__Vector_impl_data._M_finish[-1] & 0x7f) != 0)) {
      bVar2 = 0;
      uVar3 = 0;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        uVar3 = uVar3 | (ulong)local_30._M_impl.super__Vector_impl_data._M_start[uVar5] <<
                        (bVar2 & 0x3f);
        bVar2 = bVar2 + 8;
      }
      if ((char)local_30._M_impl.super__Vector_impl_data._M_finish[-1] < '\0') {
        uVar3 = -(uVar3 & ~(0x80L << ((char)((int)uVar1 << 3) - 8U & 0x3f)));
      }
      bVar4 = true;
      if (int64_value != (int64_t *)0x0) {
        *int64_value = uVar3;
      }
      goto LAB_002aaabf;
    }
  }
  bVar4 = false;
LAB_002aaabf:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return bVar4;
}

Assistant:

bool ScriptElement::ConvertBinaryToNumber(int64_t* int64_value) const {
  bool is_success = false;
  std::vector<uint8_t> vch = binary_data_.GetBytes();
  if (((type_ == kElementBinary) || (type_ == kElementNumber)) &&
      (vch.size() <= 5) && ((vch.back() & 0x7f) != 0)) {
    int64_t val = 0;
    for (size_t i = 0; i != vch.size(); ++i) {
      val |= static_cast<int64_t>(vch[i]) << 8 * i;
    }

    if (vch.back() & 0x80) {
      val = -((int64_t)(val & ~(0x80ULL << (8 * (vch.size() - 1)))));
    }
    is_success = true;
    if (int64_value != nullptr) {
      *int64_value = val;
    }
  }
  return is_success;
}